

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O1

bool duckdb::DecimalCastOperation::Finalize<duckdb::DecimalCastData<int>,false>
               (DecimalCastData<int> *state)

{
  uint uVar1;
  uint uVar2;
  uint8_t uVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  uint uVar14;
  uint uVar17;
  uint uVar18;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint uVar19;
  uint uVar20;
  
  if ((state->exponent_type != POSITIVE) &&
     (uVar3 = state->decimal_count - state->scale,
     state->scale <= state->decimal_count && uVar3 != '\0')) {
    state->excessive_decimals = uVar3;
  }
  if ((state->excessive_decimals != '\0') &&
     (bVar4 = TruncateExcessiveDecimals<duckdb::DecimalCastData<int>,false>(state), !bVar4)) {
    return false;
  }
  if (((state->exponent_type == NONE) && (state->round_set == true)) &&
     (state->should_round == true)) {
    state->result = state->result + 1;
  }
  if (state->decimal_count < state->scale) {
    bVar5 = state->scale + ~state->decimal_count;
    auVar13._1_3_ = 0;
    auVar13[0] = bVar5;
    auVar13[4] = bVar5;
    auVar13._5_3_ = 0;
    auVar13[8] = bVar5;
    auVar13._9_3_ = 0;
    auVar13[0xc] = bVar5;
    auVar13._13_3_ = 0;
    uVar1 = state->result;
    uVar14 = 1;
    uVar2 = 1;
    uVar20 = 1;
    iVar6 = 4;
    do {
      uVar12 = uVar20;
      uVar11 = uVar2;
      uVar10 = uVar14;
      uVar9 = uVar1;
      uVar1 = uVar9 * 10;
      uVar2 = uVar11 * 10;
      auVar16._4_4_ = uVar10;
      auVar16._0_4_ = uVar10;
      auVar16._8_4_ = uVar12;
      auVar16._12_4_ = uVar12;
      uVar20 = (uint)((auVar16._8_8_ & 0xffffffff) * 10);
      iVar7 = iVar6 + -4;
      iVar8 = iVar6 + (bVar5 + 4 & 0xfffffffc);
      uVar14 = uVar10 * 10;
      iVar6 = iVar7;
    } while (iVar8 != 8);
    iVar7 = -iVar7;
    auVar15._4_4_ = iVar7;
    auVar15._0_4_ = iVar7;
    auVar15._8_4_ = iVar7;
    auVar15._12_4_ = iVar7;
    auVar13 = auVar13 | _DAT_01352200;
    auVar16 = (auVar15 | ram0x01352250) ^ _DAT_01352200;
    uVar14 = -(uint)(auVar13._0_4_ < auVar16._0_4_);
    uVar17 = -(uint)(auVar13._4_4_ < auVar16._4_4_);
    uVar18 = -(uint)(auVar13._8_4_ < auVar16._8_4_);
    uVar19 = -(uint)(auVar13._12_4_ < auVar16._12_4_);
    state->result =
         (~uVar18 & uVar2 | uVar11 & uVar18) * (~uVar14 & uVar1 | uVar9 & uVar14) *
         (~uVar17 & uVar10 * 10 | uVar10 & uVar17) * (~uVar19 & uVar20 | uVar12 & uVar19);
  }
  return state->result < state->limit;
}

Assistant:

static bool Finalize(T &state) {
		if (state.exponent_type != ExponentType::POSITIVE && state.decimal_count > state.scale) {
			//! Did not encounter an exponent, but ALLOW_EXPONENT was on
			state.excessive_decimals = state.decimal_count - state.scale;
		}
		if (state.excessive_decimals && !TruncateExcessiveDecimals<T, NEGATIVE>(state)) {
			return false;
		}
		if (state.exponent_type == ExponentType::NONE && state.round_set && state.should_round) {
			RoundUpResult<T, NEGATIVE>(state);
		}
		//  if we have not gotten exactly "scale" decimals, we need to multiply the result
		//  e.g. if we have a string "1.0" that is cast to a DECIMAL(9,3), the value needs to be 1000
		//  but we have only gotten the value "10" so far, so we multiply by 1000
		for (uint8_t i = state.decimal_count; i < state.scale; i++) {
			state.result *= 10;
		}
		if (NEGATIVE) {
			return state.result > -state.limit;
		} else {
			return state.result < state.limit;
		}
	}